

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O1

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::collect_changes
          (DynamicPartialIndex *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *sv,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *graph,vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *reverse_graph,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  uchar uVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  iterator iVar6;
  pointer pvVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  DynamicPartialIndex *this_00;
  uint *s;
  pointer puVar11;
  uint *__args;
  
  this->back_ = 0;
  this->front_ = 0;
  puVar3 = (sv->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = this;
  for (puVar11 = (sv->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start; puVar11 != puVar3; puVar11 = puVar11 + 1) {
    uVar2 = *puVar11;
    puVar4 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar4) <= (ulong)uVar2)
    goto LAB_0010bdf8;
    if (puVar4[uVar2] != '\0') {
      bVar8 = has_parent(this_00,uVar2,reverse_graph,dist);
      if (!bVar8) {
        uVar2 = *puVar11;
        uVar9 = this->back_;
        this->back_ = uVar9 + 1;
        puVar5 = (this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->queue_->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar5 >> 2) <= uVar9)
        goto LAB_0010bdf8;
        puVar5[uVar9] = uVar2;
        puVar4 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)puVar4) <=
            (ulong)*puVar11) goto LAB_0010bdf8;
        puVar4[*puVar11] = '?';
        this_00 = (DynamicPartialIndex *)this->updated_;
        iVar6._M_current = (uint *)this_00->graph_;
        if (iVar6._M_current == *(uint **)&this_00->k_) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,iVar6,puVar11);
        }
        else {
          *iVar6._M_current = *puVar11;
          this_00->graph_ = (Graph *)(iVar6._M_current + 1);
        }
      }
    }
  }
  while( true ) {
    uVar9 = this->front_;
    if (this->back_ == uVar9) {
      return;
    }
    this->front_ = uVar9 + 1;
    puVar11 = (this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)puVar11 >> 2) <= uVar9)
    break;
    uVar10 = (ulong)puVar11[uVar9];
    pvVar7 = (graph->
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar9 = ((long)(graph->
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 3) *
            -0x5555555555555555;
    if (uVar9 < uVar10 || uVar9 - uVar10 == 0) break;
    puVar11 = *(pointer *)
               ((long)&pvVar7[uVar10].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data + 8);
    for (__args = pvVar7[uVar10].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start; __args != puVar11; __args = __args + 1)
    {
      uVar2 = *__args;
      puVar4 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar4) <= (ulong)uVar2)
      goto LAB_0010bdf8;
      uVar1 = puVar4[uVar2];
      if ((uVar1 != '\0') && (uVar1 != '?')) {
        bVar8 = has_parent(this_00,uVar2,reverse_graph,dist);
        if (!bVar8) {
          uVar2 = *__args;
          uVar9 = this->back_;
          this->back_ = uVar9 + 1;
          puVar3 = (this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->queue_->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish - (long)puVar3 >> 2) <= uVar9)
          goto LAB_0010bdf8;
          puVar3[uVar9] = uVar2;
          puVar4 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          if ((ulong)((long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)puVar4) <=
              (ulong)*__args) goto LAB_0010bdf8;
          puVar4[*__args] = '?';
          this_00 = (DynamicPartialIndex *)this->updated_;
          iVar6._M_current = (uint *)this_00->graph_;
          if (iVar6._M_current == *(uint **)&this_00->k_) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,iVar6,__args);
          }
          else {
            *iVar6._M_current = *__args;
            this_00->graph_ = (Graph *)(iVar6._M_current + 1);
          }
        }
      }
    }
  }
LAB_0010bdf8:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void DynamicScalableKReach::DynamicPartialIndex::collect_changes(const std::vector<vertex_t> &sv,
                                                                 const std::vector<std::vector<vertex_t>> &graph,
                                                                 const std::vector<std::vector<vertex_t>> &reverse_graph,
                                                                 std::vector<distance_t> &dist) {
    back_ = 0;
    front_ = 0;
    for (const auto &s : sv) {
        if (dist.at(s) > 0 && !has_parent(s, reverse_graph, dist)) {
            queue_.at(back_++) = s;
            dist.at(s) = INF8;
            updated_.push_back(s);
        }
    }
    while (back_ != front_) {
        auto cur = queue_.at(front_++);
        for (const auto &nxt : graph.at(cur)) {
            if (dist.at(nxt) != INF8 && dist.at(nxt) > 0 && !has_parent(nxt, reverse_graph, dist)) {
                queue_.at(back_++) = nxt;
                dist.at(nxt) = INF8;
                updated_.push_back(nxt);
            }
        }
    }
}